

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O0

Am_Value option_button_items_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Object local_48;
  Am_Object o;
  Am_Value v;
  Am_Object *self_local;
  Am_Value *value;
  
  Am_Value::Am_Value((Am_Value *)self);
  Am_Value::operator=((Am_Value *)self,0);
  Am_Value::Am_Value((Am_Value *)&o);
  Am_Object::Am_Object(&local_48);
  pAVar2 = Am_Object::Peek(in_RSI,0x68,0);
  Am_Value::operator=((Am_Value *)&o,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&o);
  if (bVar1) {
    Am_Object::operator=(&local_48,(Am_Value *)&o);
    pAVar2 = Am_Object::Peek(&local_48,0x1d3,0);
    Am_Value::operator=((Am_Value *)&o,pAVar2);
    bVar1 = Am_Value::Valid((Am_Value *)&o);
    if (bVar1) {
      Am_Object::operator=(&local_48,(Am_Value *)&o);
      pAVar2 = Am_Object::Peek(&local_48,0xa2,0);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
  }
  Am_Object::~Am_Object(&local_48);
  Am_Value::~Am_Value((Am_Value *)&o);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, option_button_items)
{
  Am_Value value;
  value = 0;
  Am_Value v;
  Am_Object o;
  v = self.Peek(Am_WINDOW);
  if (v.Valid()) {
    o = v;
    v = o.Peek(Am_FOR_ITEM);
    if (v.Valid()) {
      o = v;
      value = o.Peek(Am_ITEMS);
    }
  }
  return value;
}